

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> * __thiscall
glu::sl::ShaderParser::parse
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          ShaderParser *this)

{
  Resource *pRVar1;
  reference pvVar2;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_1d;
  uint local_1c;
  ShaderParser *pSStack_18;
  int dataLen;
  ShaderParser *this_local;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *nodeList;
  
  pSStack_18 = this;
  this_local = (ShaderParser *)__return_storage_ptr__;
  pRVar1 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     (&(this->m_resource).
                       super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>);
  local_1c = (*pRVar1->_vptr_Resource[3])();
  std::vector<char,_std::allocator<char>_>::resize(&this->m_input,(long)(int)(local_1c + 1));
  pRVar1 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     (&(this->m_resource).
                       super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>);
  (*pRVar1->_vptr_Resource[5])(pRVar1,0);
  pRVar1 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::operator->
                     (&(this->m_resource).
                       super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_input,0);
  (*pRVar1->_vptr_Resource[2])(pRVar1,pvVar2,(ulong)local_1c);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_input,(long)(int)local_1c);
  *pvVar2 = '\0';
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](&this->m_input,0);
  this->m_curPtr = pvVar2;
  this->m_curToken = TOKEN_INVALID;
  std::__cxx11::string::operator=((string *)&this->m_curTokenStr,"");
  advanceToken(this);
  local_1d = 0;
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::vector(__return_storage_ptr__);
  while( true ) {
    while( true ) {
      while( true ) {
        while (this->m_curToken == TOKEN_CASE) {
          parseShaderCase(this,__return_storage_ptr__);
        }
        if (this->m_curToken != TOKEN_GROUP) break;
        parseShaderGroup(this,__return_storage_ptr__);
      }
      if (this->m_curToken != TOKEN_IMPORT) break;
      parseImport(this,__return_storage_ptr__);
    }
    if (this->m_curToken == TOKEN_EOF) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"invalid token encountered at main level: \'",&local_91);
    std::operator+(&local_70,&local_90,&this->m_curTokenStr);
    std::operator+(&local_50,&local_70,"\'");
    parseError(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  assumeToken(this,TOKEN_EOF);
  return __return_storage_ptr__;
}

Assistant:

vector<tcu::TestNode*> ShaderParser::parse (void)
{
	const int	dataLen		= m_resource->getSize();

	m_input.resize(dataLen+1);
	m_resource->setPosition(0);
	m_resource->read((deUint8*)&m_input[0], dataLen);
	m_input[dataLen] = '\0';

	// Initialize parser.
	m_curPtr		= &m_input[0];
	m_curToken		= TOKEN_INVALID;
	m_curTokenStr	= "";
	advanceToken();

	vector<tcu::TestNode*> nodeList;

	// Parse all cases.
	PARSE_DBG(("parse()\n"));
	for (;;)
	{
		if (m_curToken == TOKEN_CASE)
			parseShaderCase(nodeList);
		else if (m_curToken == TOKEN_GROUP)
			parseShaderGroup(nodeList);
		else if (m_curToken == TOKEN_IMPORT)
			parseImport(nodeList);
		else if (m_curToken == TOKEN_EOF)
			break;
		else
			parseError(string("invalid token encountered at main level: '") + m_curTokenStr + "'");
	}

	assumeToken(TOKEN_EOF);
//	printf("  parsed %d test cases.\n", caseList.size());
	return nodeList;
}